

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::MethodCallExpr::do_evaluate
          (Value *__return_storage_ptr__,MethodCallExpr *this,shared_ptr<minja::Context> *context)

{
  Expression *this_00;
  size_type sVar1;
  element_type *peVar2;
  pointer pbVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  Value *pVVar7;
  size_t index;
  size_t sVar8;
  runtime_error *prVar9;
  pointer v;
  value_type *this_01;
  _Alloc_hider index_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  initializer_list<minja::Value> __l;
  allocator<char> local_251;
  Value *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  value_type key;
  Value local_1d8;
  ArgumentsValue vargs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  Value obj;
  vector<minja::Value,_std::allocator<minja::Value>_> local_98;
  vector<minja::Value,_std::allocator<minja::Value>_> local_78;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<minja::Value,_std::allocator<minja::Value>_> local_48;
  
  this_00 = (this->object).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_250 = __return_storage_ptr__;
  if (this_00 == (Expression *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"MethodCallExpr.object is null");
LAB_00186871:
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"MethodCallExpr.method is null");
    goto LAB_00186871;
  }
  Expression::evaluate(&obj,this_00,context);
  ArgumentsExpression::evaluate(&vargs,&this->args,context);
  if ((((obj.object_.
         super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) &&
       (obj.array_.
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0)) && (obj.primitive_.m_data.m_type == null)) &&
     (obj.callable_.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&sep,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    std::operator+(&str,"Trying to call method \'",&sep);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,&str,
                   "\' on null");
    std::runtime_error::runtime_error(prVar9,(string *)&key);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (obj.array_.
      super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"append");
    std::__cxx11::string::~string((string *)&key);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"append method",(allocator<char> *)&parts);
      str._M_dataplus._M_p = (pointer)0x1;
      str._M_string_length = 1;
      sep._M_dataplus._M_p = (pointer)0x0;
      sep._M_string_length = 0;
      ArgumentsValue::expectArgs
                (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&str,
                 (pair<unsigned_long,_unsigned_long> *)&sep);
      std::__cxx11::string::~string((string *)&key);
      Value::push_back(&obj,vargs.args.
                            super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    else {
      std::__cxx11::string::string
                ((string *)&key,
                 (string *)
                 &((this->method).
                   super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                );
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key,"pop");
      std::__cxx11::string::~string((string *)&key);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"pop method",(allocator<char> *)&parts);
        str._M_dataplus._M_p = (pointer)0x0;
        str._M_string_length = 1;
        sep._M_dataplus._M_p = (pointer)0x0;
        sep._M_string_length = 0;
        ArgumentsValue::expectArgs
                  (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&str,
                   (pair<unsigned_long,_unsigned_long> *)&sep);
        std::__cxx11::string::~string((string *)&key);
        if (vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
            super__Vector_impl_data._M_start ==
            vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          Value::Value(&key);
        }
        else {
          Value::Value(&key,vargs.args.
                            super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                            super__Vector_impl_data._M_start);
        }
        Value::pop(local_250,&obj,&key);
        goto LAB_001860d2;
      }
      std::__cxx11::string::string
                ((string *)&key,
                 (string *)
                 &((this->method).
                   super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                );
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key,"insert");
      std::__cxx11::string::~string((string *)&key);
      if (!bVar4) goto LAB_001869c4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"insert method",(allocator<char> *)&parts);
      str._M_dataplus._M_p = (pointer)0x2;
      str._M_string_length = 2;
      sep._M_dataplus._M_p = (pointer)0x0;
      sep._M_string_length = 0;
      ArgumentsValue::expectArgs
                (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&str,
                 (pair<unsigned_long,_unsigned_long> *)&sep);
      std::__cxx11::string::~string((string *)&key);
      index = Value::get<long>(vargs.args.
                               super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      if (((long)index < 0) || (sVar8 = Value::size(&obj), (long)sVar8 < (long)index)) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Index out of range for insert method");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Value::insert(&obj,index,
                    vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
    }
    pVVar7 = local_250;
    Value::Value(local_250);
    goto LAB_00186620;
  }
  if (obj.object_.
      super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"items");
    std::__cxx11::string::~string((string *)&key);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"items method",(allocator<char> *)&parts);
      str._M_dataplus._M_p = (pointer)0x0;
      str._M_string_length = 0;
      sep._M_dataplus._M_p = (pointer)0x0;
      sep._M_string_length = 0;
      ArgumentsValue::expectArgs
                (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&str,
                 (pair<unsigned_long,_unsigned_long> *)&sep);
      std::__cxx11::string::~string((string *)&key);
      local_78.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::array(local_250,&local_78);
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_78);
      Value::keys((vector<minja::Value,_std::allocator<minja::Value>_> *)&sep,&obj);
      sVar1 = sep._M_string_length;
      for (index_00 = sep._M_dataplus; index_00._M_p != (pointer)sVar1;
          index_00._M_p = index_00._M_p + 0x50) {
        Value::Value(&key,(Value *)index_00._M_p);
        pVVar7 = Value::at(&obj,(Value *)index_00._M_p);
        Value::Value(&local_1d8,pVVar7);
        __l._M_len = 2;
        __l._M_array = &key;
        std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                  (&local_48,__l,(allocator_type *)&parts);
        Value::array((Value *)&str,&local_48);
        Value::push_back(local_250,(Value *)&str);
        Value::~Value((Value *)&str);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_48);
        lVar11 = 0x50;
        do {
          Value::~Value((Value *)((long)&key.super_enable_shared_from_this<minja::Value>.
                                         _M_weak_this.
                                         super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr + lVar11));
          lVar11 = lVar11 + -0x50;
        } while (lVar11 != -0x50);
      }
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector
                ((vector<minja::Value,_std::allocator<minja::Value>_> *)&sep);
      pVVar7 = local_250;
      goto LAB_00186620;
    }
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"pop");
    std::__cxx11::string::~string((string *)&key);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"pop method",(allocator<char> *)&parts);
      str._M_dataplus._M_p = (pointer)0x1;
      str._M_string_length = 1;
      sep._M_dataplus._M_p = (pointer)0x0;
      sep._M_string_length = 0;
      ArgumentsValue::expectArgs
                (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&str,
                 (pair<unsigned_long,_unsigned_long> *)&sep);
      std::__cxx11::string::~string((string *)&key);
      pVVar7 = local_250;
      Value::pop(local_250,&obj,
                 vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                 super__Vector_impl_data._M_start);
      goto LAB_00186620;
    }
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"get");
    std::__cxx11::string::~string((string *)&key);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"get method",(allocator<char> *)&parts);
      str._M_dataplus._M_p = (pointer)0x1;
      str._M_string_length = 2;
      sep._M_dataplus._M_p = (pointer)0x0;
      sep._M_string_length = 0;
      ArgumentsValue::expectArgs
                (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&str,
                 (pair<unsigned_long,_unsigned_long> *)&sep);
      std::__cxx11::string::~string((string *)&key);
      Value::Value(&key,vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      if ((long)vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                super__Vector_impl_data._M_start == 0x50) {
        bVar4 = Value::contains(&obj,&key);
        if (!bVar4) {
          Value::Value(local_250);
          goto LAB_001860d2;
        }
LAB_001863cb:
        pVVar7 = Value::at(&obj,&key);
      }
      else {
        bVar4 = Value::contains(&obj,&key);
        if (bVar4) goto LAB_001863cb;
        pVVar7 = vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
      }
      Value::Value(local_250,pVVar7);
    }
    else {
      std::__cxx11::string::string
                ((string *)&key,
                 (string *)
                 &((this->method).
                   super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                );
      bVar4 = Value::contains(&obj,(string *)&key);
      std::__cxx11::string::~string((string *)&key);
      if (!bVar4) goto LAB_001869c4;
      std::__cxx11::string::string
                ((string *)&sep,
                 (string *)
                 &((this->method).
                   super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                );
      Value::Value((Value *)&str,&sep);
      pVVar7 = Value::at(&obj,(Value *)&str);
      Value::Value(&key,pVVar7);
      Value::~Value((Value *)&str);
      std::__cxx11::string::~string((string *)&sep);
      if (key.callable_.
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&parts,
                   (string *)
                   &((this->method).
                     super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    name);
        std::operator+(&sep,"Property \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts);
        std::operator+(&str,&sep,"\' is not callable");
        std::runtime_error::runtime_error(prVar9,(string *)&str);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Value::call(local_250,&key,context,&vargs);
    }
LAB_001860d2:
    Value::~Value(&key);
    pVVar7 = local_250;
    goto LAB_00186620;
  }
  if (obj.primitive_.m_data.m_type != string) {
LAB_001869c4:
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&str,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                   "Unknown method: ",&str);
    std::runtime_error::runtime_error(prVar9,(string *)&key);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Value::get<std::__cxx11::string>(&str,&obj);
  std::__cxx11::string::string
            ((string *)&key,
             (string *)
             &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->name);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                          "strip");
  std::__cxx11::string::~string((string *)&key);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&key,"strip method",&local_251);
    sep._M_dataplus._M_p = (pointer)0x0;
    sep._M_string_length = 1;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ArgumentsValue::expectArgs
              (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&sep,
               (pair<unsigned_long,_unsigned_long> *)&parts);
    std::__cxx11::string::~string((string *)&key);
    if (vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&key,"",(allocator<char> *)&sep);
    }
    else {
      Value::get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                 vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    strip(&sep,&str,(string *)&key,true,true);
    Value::Value(local_250,&sep);
LAB_001865fa:
    std::__cxx11::string::~string((string *)&sep);
LAB_00186604:
    this_01 = &key;
  }
  else {
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"lstrip");
    std::__cxx11::string::~string((string *)&key);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&key,"lstrip method",&local_251);
      sep._M_dataplus._M_p = (pointer)0x0;
      sep._M_string_length = 1;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ArgumentsValue::expectArgs
                (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&sep,
                 (pair<unsigned_long,_unsigned_long> *)&parts);
      std::__cxx11::string::~string((string *)&key);
      if (vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"",(allocator<char> *)&sep);
      }
      else {
        Value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                   vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      strip(&sep,&str,(string *)&key,true,false);
      Value::Value(local_250,&sep);
      goto LAB_001865fa;
    }
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"rstrip");
    std::__cxx11::string::~string((string *)&key);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&key,"rstrip method",&local_251);
      sep._M_dataplus._M_p = (pointer)0x0;
      sep._M_string_length = 1;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ArgumentsValue::expectArgs
                (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&sep,
                 (pair<unsigned_long,_unsigned_long> *)&parts);
      std::__cxx11::string::~string((string *)&key);
      if (vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"",(allocator<char> *)&sep);
      }
      else {
        Value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                   vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      strip(&sep,&str,(string *)&key,false,true);
      Value::Value(local_250,&sep);
      goto LAB_001865fa;
    }
    std::__cxx11::string::string
              ((string *)&key,
               (string *)
               &((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->name);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key,"split");
    std::__cxx11::string::~string((string *)&key);
    if (!bVar4) {
      std::__cxx11::string::string
                ((string *)&key,
                 (string *)
                 &((this->method).
                   super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                );
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key,"capitalize");
      std::__cxx11::string::~string((string *)&key);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"capitalize method",&local_251);
        sep._M_dataplus._M_p = (pointer)0x0;
        sep._M_string_length = 0;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ArgumentsValue::expectArgs
                  (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&sep,
                   (pair<unsigned_long,_unsigned_long> *)&parts);
        std::__cxx11::string::~string((string *)&key);
        sVar1 = str._M_string_length;
        std::__cxx11::string::string((string *)&key,(string *)&str);
        if (sVar1 != 0) {
          iVar6 = toupper((int)*(char *)&((key.super_enable_shared_from_this<minja::Value>.
                                           _M_weak_this.
                                           super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_enable_shared_from_this<minja::Value>).
                                         _M_weak_this.
                                         super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr);
          *(char *)&((key.super_enable_shared_from_this<minja::Value>._M_weak_this.
                      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<minja::Value>)._M_weak_this.
                    super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (char)iVar6;
        }
        Value::Value(local_250,(string *)&key);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&key,
                   (string *)
                   &((this->method).
                     super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    name);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&key,"endswith");
        std::__cxx11::string::~string((string *)&key);
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&key,"endswith method",&local_251);
          sep._M_dataplus._M_p = (pointer)0x1;
          sep._M_string_length = 1;
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ArgumentsValue::expectArgs
                    (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&sep,
                     (pair<unsigned_long,_unsigned_long> *)&parts);
          std::__cxx11::string::~string((string *)&key);
          Value::get<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                     vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          if (str._M_string_length <
              key.super_enable_shared_from_this<minja::Value>._M_weak_this.
              super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
            bVar4 = false;
          }
          else {
            local_50.current._M_current =
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )((long)&((key.super_enable_shared_from_this<minja::Value>._M_weak_this.
                             super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           super_enable_shared_from_this<minja::Value>)._M_weak_this.
                           super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                   (long)&(key.super_enable_shared_from_this<minja::Value>._M_weak_this.
                           super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base);
            local_58.current._M_current =
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )key.super_enable_shared_from_this<minja::Value>._M_weak_this.
                     super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_60.current._M_current =
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(str._M_dataplus._M_p + str._M_string_length);
            bVar4 = std::
                    equal<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                              (&local_50,&local_58,&local_60);
          }
          sep._M_dataplus._M_p._0_1_ = bVar4;
          Value::Value(local_250,(bool *)&sep);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&key,
                     (string *)
                     &((this->method).
                       super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      name);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&key,"title");
          std::__cxx11::string::~string((string *)&key);
          if (!bVar4) {
            std::__cxx11::string::~string((string *)&str);
            goto LAB_001869c4;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&key,"title method",&local_251);
          sep._M_dataplus._M_p = (pointer)0x0;
          sep._M_string_length = 0;
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ArgumentsValue::expectArgs
                    (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&sep,
                     (pair<unsigned_long,_unsigned_long> *)&parts);
          std::__cxx11::string::~string((string *)&key);
          std::__cxx11::string::string((string *)&key,(string *)&str);
          for (p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              peVar2 = key.super_enable_shared_from_this<minja::Value>._M_weak_this.
                       super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              key.super_enable_shared_from_this<minja::Value>._M_weak_this.
              super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              p_Var10; p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 ((long)&p_Var10->_vptr__Sp_counted_base + 1)) {
            if ((p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
               (iVar6 = isspace((int)(char)((undefined1 *)
                                           ((long)&key.super_enable_shared_from_this<minja::Value>.
                                                   _M_weak_this.
                                                                                                      
                                                  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr[-1].primitive_.m_data.m_value + 7))
                                           [(long)p_Var10]), iVar6 != 0)) {
              iVar6 = toupper((int)*(char *)((long)&p_Var10->_vptr__Sp_counted_base +
                                            (long)&peVar2->
                                                  super_enable_shared_from_this<minja::Value>));
              uVar5 = (undefined1)iVar6;
            }
            else {
              iVar6 = tolower((int)*(char *)((long)&p_Var10->_vptr__Sp_counted_base +
                                            (long)&peVar2->
                                                  super_enable_shared_from_this<minja::Value>));
              uVar5 = (undefined1)iVar6;
            }
            *(undefined1 *)
             ((long)&p_Var10->_vptr__Sp_counted_base +
             (long)&peVar2->super_enable_shared_from_this<minja::Value>) = uVar5;
          }
          Value::Value(local_250,(string *)&key);
        }
      }
      goto LAB_00186604;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&key,"split method",&local_251);
    sep._M_dataplus._M_p = (pointer)0x1;
    sep._M_string_length = 1;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ArgumentsValue::expectArgs
              (&vargs,(string *)&key,(pair<unsigned_long,_unsigned_long> *)&sep,
               (pair<unsigned_long,_unsigned_long> *)&parts);
    std::__cxx11::string::~string((string *)&key);
    Value::get<std::__cxx11::string>
              (&sep,vargs.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar11 = std::__cxx11::string::find((string *)&str,(ulong)&sep);
    while (lVar11 != -1) {
      std::__cxx11::string::substr((ulong)&key,(ulong)&str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
      std::__cxx11::string::~string((string *)&key);
      lVar11 = std::__cxx11::string::find((string *)&str,(ulong)&sep);
    }
    std::__cxx11::string::substr((ulong)&key,(ulong)&str);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
    std::__cxx11::string::~string((string *)&key);
    local_98.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::array(local_250,&local_98);
    std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_98);
    pbVar3 = parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (v = parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; v != pbVar3; v = v + 1) {
      Value::Value(&key,v);
      Value::push_back(local_250,&key);
      Value::~Value(&key);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parts);
    this_01 = (value_type *)&sep;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&str);
  pVVar7 = local_250;
LAB_00186620:
  ArgumentsValue::~ArgumentsValue(&vargs);
  Value::~Value(&obj);
  return pVVar7;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!object) throw std::runtime_error("MethodCallExpr.object is null");
        if (!method) throw std::runtime_error("MethodCallExpr.method is null");
        auto obj = object->evaluate(context);
        auto vargs = args.evaluate(context);
        if (obj.is_null()) {
          throw std::runtime_error("Trying to call method '" + method->get_name() + "' on null");
        }
        if (obj.is_array()) {
          if (method->get_name() == "append") {
              vargs.expectArgs("append method", {1, 1}, {0, 0});
              obj.push_back(vargs.args[0]);
              return Value();
          } else if (method->get_name() == "pop") {
              vargs.expectArgs("pop method", {0, 1}, {0, 0});
              return obj.pop(vargs.args.empty() ? Value() : vargs.args[0]);
          } else if (method->get_name() == "insert") {
              vargs.expectArgs("insert method", {2, 2}, {0, 0});
              auto index = vargs.args[0].get<int64_t>();
              if (index < 0 || index > (int64_t) obj.size()) throw std::runtime_error("Index out of range for insert method");
              obj.insert(index, vargs.args[1]);
              return Value();
          }
        } else if (obj.is_object()) {
          if (method->get_name() == "items") {
            vargs.expectArgs("items method", {0, 0}, {0, 0});
            auto result = Value::array();
            for (const auto& key : obj.keys()) {
              result.push_back(Value::array({key, obj.at(key)}));
            }
            return result;
          } else if (method->get_name() == "pop") {
            vargs.expectArgs("pop method", {1, 1}, {0, 0});
            return obj.pop(vargs.args[0]);
          } else if (method->get_name() == "get") {
            vargs.expectArgs("get method", {1, 2}, {0, 0});
            auto key = vargs.args[0];
            if (vargs.args.size() == 1) {
              return obj.contains(key) ? obj.at(key) : Value();
            } else {
              return obj.contains(key) ? obj.at(key) : vargs.args[1];
            }
          } else if (obj.contains(method->get_name())) {
            auto callable = obj.at(method->get_name());
            if (!callable.is_callable()) {
              throw std::runtime_error("Property '" + method->get_name() + "' is not callable");
            }
            return callable.call(context, vargs);
          }
        } else if (obj.is_string()) {
          auto str = obj.get<std::string>();
          if (method->get_name() == "strip") {
            vargs.expectArgs("strip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars));
          } else if (method->get_name() == "lstrip") {
            vargs.expectArgs("lstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ true, /* right= */ false));
          } else if (method->get_name() == "rstrip") {
            vargs.expectArgs("rstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ false, /* right= */ true));
          } else if (method->get_name() == "split") {
            vargs.expectArgs("split method", {1, 1}, {0, 0});
            auto sep = vargs.args[0].get<std::string>();
            auto parts = split(str, sep);
            Value result = Value::array();
            for (const auto& part : parts) {
              result.push_back(Value(part));
            }
            return result;
          } else if (method->get_name() == "capitalize") {
            vargs.expectArgs("capitalize method", {0, 0}, {0, 0});
            return Value(capitalize(str));
          } else if (method->get_name() == "endswith") {
            vargs.expectArgs("endswith method", {1, 1}, {0, 0});
            auto suffix = vargs.args[0].get<std::string>();
            return suffix.length() <= str.length() && std::equal(suffix.rbegin(), suffix.rend(), str.rbegin());
          } else if (method->get_name() == "title") {
            vargs.expectArgs("title method", {0, 0}, {0, 0});
            auto res = str;
            for (size_t i = 0, n = res.size(); i < n; ++i) {
              if (i == 0 || std::isspace(res[i - 1])) res[i] = std::toupper(res[i]);
              else res[i] = std::tolower(res[i]);
            }
            return res;
          }
        }
        throw std::runtime_error("Unknown method: " + method->get_name());
    }